

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionModel.hpp
# Opt level: O2

VectorXf __thiscall
eos::morphablemodel::draw_sample
          (morphablemodel *this,ExpressionModel *expression_model,
          vector<float,_std::allocator<float>_> *expression_coefficients)

{
  __index_type _Var1;
  float *__ptr;
  pointer pBVar2;
  PointerType dataPtr;
  variant_alternative_t<0UL,_variant<PcaModel,_vector<Blendshape,_allocator<Blendshape>_>_>_>
  *coefficients;
  variant_alternative_t<1UL,_variant<PcaModel,_vector<Blendshape,_allocator<Blendshape>_>_>_>
  *blendshapes;
  runtime_error *this_00;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index extraout_RDX_01;
  Index extraout_RDX_02;
  Index IVar3;
  VectorXf VVar4;
  PcaModel local_80;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  _Var1 = (expression_model->
          super__Variant_base<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
          ).
          super__Move_assign_alias<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape>_>
          .
          super__Copy_assign_alias<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape>_>
          .
          super__Move_ctor_alias<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape>_>
          .
          super__Copy_ctor_alias<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape>_>
          .
          super__Variant_storage_alias<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape>_>
          ._M_index;
  if (_Var1 == '\x01') {
    blendshapes = std::
                  get<1ul,eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>
                            (expression_model);
    pBVar2 = (blendshapes->
             super__Vector_base<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((blendshapes->
        super__Vector_base<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>
        )._M_impl.super__Vector_impl_data._M_finish == pBVar2) {
      __assert_fail("expression_blendshapes.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/morphablemodel/ExpressionModel.hpp"
                    ,0x49,
                    "Eigen::VectorXf eos::morphablemodel::draw_sample(const ExpressionModel &, std::vector<float>)"
                   );
    }
    if ((expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::setZero
                ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)this,
                 (pBVar2->deformation).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                 .m_storage.m_rows);
      IVar3 = extraout_RDX_02;
    }
    else {
      to_matrix((MatrixXf *)
                &local_80.orthonormal_pca_basis.
                 super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
                blendshapes);
      dataPtr = (expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                .super__Vector_impl_data._M_start;
      Eigen::
      MapBase<Eigen::Map<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::
      MapBase((MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
               *)&local_80.triangle_list,dataPtr,
              (long)(expression_coefficients->super__Vector_base<float,_std::allocator<float>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)dataPtr >> 2);
      Eigen::
      Product<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Map<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
      ::Product((Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 *)&local_80,
                (Lhs *)&local_80.orthonormal_pca_basis.
                        super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols,(Rhs *)&local_80.triangle_list);
      Eigen::internal::
      call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,0>>
                ((Matrix<float,__1,_1,_0,__1,_1> *)this,
                 (Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  *)&local_80);
      free((void *)local_80.orthonormal_pca_basis.
                   super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
      ;
      IVar3 = extraout_RDX_00;
    }
  }
  else {
    if (_Var1 != '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,
                 "The given ExpressionModel doesn\'t contain an expression model in the form of a PcaModel or Blendshapes."
                );
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    coefficients = std::
                   get<0ul,eos::morphablemodel::PcaModel,std::vector<eos::morphablemodel::Blendshape,std::allocator<eos::morphablemodel::Blendshape>>>
                             (expression_model);
    if ((expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (expression_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,_1,1,0,_1,1>>
                ((Matrix<float,__1,_1,_0,__1,_1> *)this,&coefficients->mean);
      IVar3 = extraout_RDX_01;
    }
    else {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)
                 &local_80.rescaled_pca_basis.
                  super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
                 expression_coefficients);
      PcaModel::draw_sample(&local_80,(vector<float,_std::allocator<float>_> *)coefficients);
      __ptr = *(float **)this;
      *(float **)this =
           local_80.mean.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
      IVar3 = *(Index *)(this + 8);
      *(Index *)(this + 8) =
           local_80.mean.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
      local_80.mean.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           __ptr;
      local_80.mean.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           IVar3;
      free(__ptr);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)
                 &local_80.rescaled_pca_basis.
                  super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
      IVar3 = extraout_RDX;
    }
  }
  VVar4.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar3;
  VVar4.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (float *)this;
  return (VectorXf)VVar4.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

inline Eigen::VectorXf draw_sample(const ExpressionModel& expression_model,
                                   std::vector<float> expression_coefficients)
{
    Eigen::VectorXf expression_sample;
    // Get a sample of the expression model, depending on whether it's a PcaModel or Blendshapes:
    if (cpp17::holds_alternative<PcaModel>(expression_model))
    {
        const auto& pca_expression_model = cpp17::get<PcaModel>(expression_model);
        if (expression_coefficients.empty())
        {
            expression_sample = pca_expression_model.get_mean();
        } else
        {
            expression_sample = pca_expression_model.draw_sample(expression_coefficients);
        }
    } else if (cpp17::holds_alternative<Blendshapes>(expression_model))
    {
        const auto& expression_blendshapes = cpp17::get<Blendshapes>(expression_model);
        assert(expression_blendshapes.size() > 0);
        if (expression_coefficients.empty())
        {
            expression_sample.setZero(expression_blendshapes[0].deformation.rows());
        } else
        {
            expression_sample = to_matrix(expression_blendshapes) *
                                Eigen::Map<const Eigen::VectorXf>(expression_coefficients.data(),
                                                                  expression_coefficients.size());
        }
    } else
    {
        throw std::runtime_error("The given ExpressionModel doesn't contain an expression model in the form "
                                 "of a PcaModel or Blendshapes.");
    }
    return expression_sample;
}